

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

bool is_smt_cpu(int cpuid)

{
  bool bVar1;
  int iVar2;
  uint in_EDI;
  char ch;
  bool is_smt;
  FILE *fp;
  char path [256];
  FILE *local_110;
  char local_108 [256];
  uint local_8;
  
  local_8 = in_EDI;
  sprintf(local_108,"/sys/devices/system/cpu/cpu%d/topology/core_cpus_list",(ulong)in_EDI);
  local_110 = fopen(local_108,"rb");
  if (local_110 == (FILE *)0x0) {
    sprintf(local_108,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list",(ulong)local_8);
    local_110 = fopen(local_108,"rb");
    if (local_110 == (FILE *)0x0) {
      return false;
    }
  }
  bVar1 = false;
  do {
    iVar2 = feof(local_110);
    if (iVar2 != 0) goto LAB_001778f2;
    iVar2 = fgetc(local_110);
  } while (((char)iVar2 != ',') && ((char)iVar2 != '-'));
  bVar1 = true;
LAB_001778f2:
  fclose(local_110);
  return bVar1;
}

Assistant:

static bool is_smt_cpu(int cpuid)
{
    // https://github.com/torvalds/linux/blob/v6.0/Documentation/ABI/stable/sysfs-devices-system-cpu#L68-72
    char path[256];
    sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/core_cpus_list", cpuid);

    FILE* fp = fopen(path, "rb");

    if (!fp)
    {
        sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/thread_siblings_list", cpuid);
        fp = fopen(path, "rb");

        if (!fp)
            return false;
    }

    bool is_smt = false;
    while (!feof(fp))
    {
        char ch = fgetc(fp);
        if (ch == ',' || ch == '-')
        {
            is_smt = true;
            break;
        }
    }

    fclose(fp);

    return is_smt;
}